

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long extraout_RDX;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  secp256k1_sha256 *hash_00;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  size_t __n;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  byte abStack_261 [57];
  secp256k1_sha256 sStack_228;
  uchar uStack_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined1 uStack_194;
  undefined1 uStack_193;
  undefined1 uStack_192;
  char cStack_191;
  ulong local_a8;
  
  hash_00 = (secp256k1_sha256 *)hash->bytes;
  hash->bytes = (long)hash_00->s + len;
  if (CARRY8((ulong)hash_00,len)) {
    secp256k1_sha256_write_cold_1();
    uVar36 = hash_00->bytes;
    if (uVar36 >> 0x3d != 0) {
      secp256k1_sha256_finalize_cold_1();
      abStack_261[0] = *(byte *)(extraout_RDX + 0x1f) & 1 | 2;
      sStack_228.s[0] = 0x6a09e667;
      sStack_228.s[1] = 0xbb67ae85;
      sStack_228.s[2] = 0x3c6ef372;
      sStack_228.s[3] = 0xa54ff53a;
      sStack_228.s[4] = 0x510e527f;
      sStack_228.s[5] = 0x9b05688c;
      sStack_228.s[6] = 0x1f83d9ab;
      sStack_228.s[7] = 0x5be0cd19;
      sStack_228.bytes = 0;
      secp256k1_sha256_write(&sStack_228,abStack_261,1);
      secp256k1_sha256_write(&sStack_228,data,0x20);
      secp256k1_sha256_finalize(&sStack_228,(uchar *)hash_00);
      return;
    }
    uStack_195 = (undefined1)(uVar36 >> 0x1d);
    uStack_196 = (undefined1)(uVar36 >> 0x25);
    uStack_197 = (undefined1)(uVar36 >> 0x2d);
    uStack_198 = (uchar)(uVar36 >> 0x35);
    cStack_191 = (char)uVar36 * '\b';
    uStack_192 = (undefined1)(uVar36 >> 5);
    uStack_193 = (undefined1)(uVar36 >> 0xd);
    uStack_194 = (undefined1)(uVar36 >> 0x15);
    secp256k1_sha256_write
              (hash_00,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar36 & 0x3f) + 1);
    secp256k1_sha256_write(hash_00,&uStack_198,8);
    lVar11 = 0;
    do {
      uVar1 = hash_00->s[lVar11];
      *(uint *)(data + lVar11 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      hash_00->s[lVar11] = 0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 8);
    return;
  }
  uVar36 = (ulong)((uint)hash_00 & 0x3f);
  __n = 0x40 - uVar36;
  local_a8 = uVar36;
  if (__n <= len) {
    local_a8 = 0;
    do {
      memcpy(hash->buf + uVar36,data,__n);
      data = data + __n;
      len = len - __n;
      uVar1 = hash->s[0];
      uVar2 = hash->s[1];
      uVar3 = hash->s[2];
      uVar4 = hash->s[3];
      uVar5 = hash->s[4];
      uVar6 = hash->s[5];
      uVar7 = hash->s[6];
      uVar8 = hash->s[7];
      uVar10 = *(uint *)hash->buf;
      uVar47 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      iVar12 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 +
               ((uVar5 << 7 | uVar5 >> 0x19) ^
               (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6));
      uVar9 = ((uVar2 | uVar1) & uVar3 | uVar2 & uVar1) +
              ((uVar1 << 10 | uVar1 >> 0x16) ^
              (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
              uVar47 + iVar12 + 0x428a2f98;
      uVar48 = uVar4 + iVar12 + uVar47 + 0x428a2f98;
      uVar10 = *(uint *)(hash->buf + 4);
      uVar23 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
      uVar16 = uVar23 | uVar10 << 0x18;
      iVar12 = ((uVar6 ^ uVar5) & uVar48 ^ uVar6) + uVar16 + uVar7;
      uVar17 = (uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6);
      uVar18 = uVar3 + iVar12 + uVar17 + 0x71374491;
      uVar25 = ((uVar9 | uVar1) & uVar2 | uVar9 & uVar1) +
               ((uVar9 * 0x400 | uVar9 >> 0x16) ^
               (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
               iVar12 + uVar17 + 0x71374491;
      uVar13 = (uVar18 * 0x80 | uVar18 >> 0x19) ^
               (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6);
      uVar17 = *(uint *)(hash->buf + 8);
      uVar24 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8;
      uVar37 = uVar24 | uVar17 << 0x18;
      iVar12 = ((uVar48 ^ uVar5) & uVar18 ^ uVar5) + uVar37 + uVar6;
      uVar33 = ((uVar25 | uVar9) & uVar1 | uVar25 & uVar9) +
               ((uVar25 * 0x400 | uVar25 >> 0x16) ^
               (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) +
               uVar13 + iVar12 + -0x4a3f0431;
      uVar14 = uVar2 + iVar12 + uVar13 + 0xb5c0fbcf;
      uVar38 = (uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6);
      uVar13 = *(uint *)(hash->buf + 0xc);
      uVar35 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8;
      uVar53 = uVar35 | uVar13 << 0x18;
      iVar12 = ((uVar18 ^ uVar48) & uVar14 ^ uVar48) + uVar5 + uVar53;
      uVar43 = ((uVar33 | uVar25) & uVar9 | uVar33 & uVar25) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) +
               uVar38 + iVar12 + -0x164a245b;
      uVar39 = uVar1 + iVar12 + uVar38 + 0xe9b5dba5;
      uVar38 = *(uint *)(hash->buf + 0x10);
      uVar52 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8;
      uVar20 = uVar52 | uVar38 << 0x18;
      iVar12 = uVar48 + uVar20 + ((uVar14 ^ uVar18) & uVar39 ^ uVar18) +
               ((uVar39 * 0x80 | uVar39 >> 0x19) ^
               (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
               0x3956c25b;
      uVar9 = uVar9 + iVar12;
      uVar54 = ((uVar43 | uVar33) & uVar25 | uVar43 & uVar33) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
      uVar48 = *(uint *)(hash->buf + 0x14);
      uVar55 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8;
      uVar21 = uVar55 | uVar48 << 0x18;
      iVar12 = uVar18 + uVar21 + ((uVar39 ^ uVar14) & uVar9 ^ uVar14) +
               ((uVar9 * 0x80 | uVar9 >> 0x19) ^
               (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x59f111f1;
      uVar25 = uVar25 + iVar12;
      uVar22 = ((uVar54 | uVar43) & uVar33 | uVar54 & uVar43) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar12;
      uVar18 = *(uint *)(hash->buf + 0x18);
      uVar56 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8;
      uVar49 = uVar56 | uVar18 << 0x18;
      iVar12 = uVar14 + uVar49 + ((uVar9 ^ uVar39) & uVar25 ^ uVar39) +
               ((uVar25 * 0x80 | uVar25 >> 0x19) ^
               (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
               -0x6dc07d5c;
      uVar33 = uVar33 + iVar12;
      uVar19 = ((uVar22 | uVar54) & uVar43 | uVar22 & uVar54) +
               ((uVar22 * 0x400 | uVar22 >> 0x16) ^
               (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar12;
      uVar14 = *(uint *)(hash->buf + 0x1c);
      uVar57 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8;
      uVar50 = uVar57 | uVar14 << 0x18;
      iVar12 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar39 + uVar50 + ((uVar25 ^ uVar9) & uVar33 ^ uVar9) + -0x54e3a12b;
      uVar43 = uVar43 + iVar12;
      uVar51 = ((uVar19 | uVar22) & uVar54 | uVar19 & uVar22) +
               ((uVar19 * 0x400 | uVar19 >> 0x16) ^
               (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar12;
      uVar39 = *(uint *)(hash->buf + 0x20);
      uVar59 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8;
      uVar40 = uVar59 | uVar39 << 0x18;
      iVar12 = uVar9 + uVar40 + ((uVar33 ^ uVar25) & uVar43 ^ uVar25) +
               ((uVar43 * 0x80 | uVar43 >> 0x19) ^
               (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
               -0x27f85568;
      uVar54 = uVar54 + iVar12;
      uVar15 = ((uVar51 | uVar19) & uVar22 | uVar51 & uVar19) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar12;
      uVar9 = *(uint *)(hash->buf + 0x24);
      uVar60 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
      uVar41 = uVar60 | uVar9 << 0x18;
      iVar12 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar25 + uVar41 + ((uVar43 ^ uVar33) & uVar54 ^ uVar33) + 0x12835b01;
      uVar22 = uVar22 + iVar12;
      uVar42 = ((uVar15 | uVar51) & uVar19 | uVar15 & uVar51) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
      uVar25 = *(uint *)(hash->buf + 0x28);
      uVar61 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8;
      uVar26 = uVar61 | uVar25 << 0x18;
      iVar12 = ((uVar22 * 0x80 | uVar22 >> 0x19) ^
               (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
               uVar33 + uVar26 + ((uVar54 ^ uVar43) & uVar22 ^ uVar43) + 0x243185be;
      uVar19 = uVar19 + iVar12;
      uVar58 = ((uVar42 | uVar15) & uVar51 | uVar42 & uVar15) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
      uVar33 = *(uint *)(hash->buf + 0x2c);
      uVar62 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8;
      uVar27 = uVar62 | uVar33 << 0x18;
      iVar12 = ((uVar19 * 0x80 | uVar19 >> 0x19) ^
               (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) +
               uVar43 + uVar27 + ((uVar22 ^ uVar54) & uVar19 ^ uVar54) + 0x550c7dc3;
      uVar51 = uVar51 + iVar12;
      uVar44 = ((uVar58 | uVar42) & uVar15 | uVar58 & uVar42) +
               ((uVar58 * 0x400 | uVar58 >> 0x16) ^
               (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar12;
      uVar43 = *(uint *)(hash->buf + 0x30);
      uVar63 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8;
      uVar28 = uVar63 | uVar43 << 0x18;
      iVar12 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               uVar54 + uVar28 + ((uVar19 ^ uVar22) & uVar51 ^ uVar22) + 0x72be5d74;
      uVar15 = uVar15 + iVar12;
      uVar45 = ((uVar44 | uVar58) & uVar42 | uVar44 & uVar58) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar12;
      uVar54 = *(uint *)(hash->buf + 0x34);
      uVar64 = uVar54 >> 0x18 | (uVar54 & 0xff0000) >> 8 | (uVar54 & 0xff00) << 8;
      uVar29 = uVar64 | uVar54 << 0x18;
      iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
               (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
               uVar22 + uVar29 + ((uVar51 ^ uVar19) & uVar15 ^ uVar19) + -0x7f214e02;
      uVar42 = uVar42 + iVar12;
      uVar65 = ((uVar45 | uVar44) & uVar58 | uVar45 & uVar44) +
               ((uVar45 * 0x400 | uVar45 >> 0x16) ^
               (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar12;
      uVar30 = (uint)hash->buf[0x39] << 0x10 | (uint)hash->buf[0x38] << 0x18;
      uVar46 = (uint)hash->buf[0x3a] << 8 | uVar30;
      uVar31 = hash->buf[0x3b] | uVar46;
      iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar19 + uVar31 + ((uVar15 ^ uVar51) & uVar42 ^ uVar51) + -0x6423f959;
      uVar58 = uVar58 + iVar12;
      uVar34 = ((uVar65 | uVar45) & uVar44 | uVar65 & uVar45) +
               ((uVar65 * 0x400 | uVar65 >> 0x16) ^
               (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar12;
      uVar22 = (uint)hash->buf[0x3d] << 0x10 | (uint)hash->buf[0x3c] << 0x18;
      uVar19 = (uint)hash->buf[0x3e] << 8 | uVar22;
      uVar32 = hash->buf[0x3f] | uVar19;
      iVar12 = ((uVar58 * 0x80 | uVar58 >> 0x19) ^
               (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6)) +
               uVar51 + uVar32 + ((uVar42 ^ uVar15) & uVar58 ^ uVar15) + -0x3e640e8c;
      uVar44 = uVar44 + iVar12;
      uVar51 = ((uVar34 | uVar65) & uVar45 | uVar34 & uVar65) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar12;
      uVar46 = uVar47 + uVar41 +
               (uVar16 >> 3 ^
               (uVar23 << 0xe | uVar16 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar16 >> 7)) +
               (uVar46 >> 10 ^ (uVar31 << 0xd | uVar30 >> 0x13) ^ (uVar31 << 0xf | uVar30 >> 0x11));
      iVar12 = uVar15 + uVar46 + ((uVar58 ^ uVar42) & uVar44 ^ uVar42) +
               ((uVar44 * 0x80 | uVar44 >> 0x19) ^
               (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
               -0x1b64963f;
      uVar45 = uVar45 + iVar12;
      uVar15 = ((uVar51 | uVar34) & uVar65 | uVar51 & uVar34) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar12;
      uVar19 = uVar16 + uVar26 +
               (uVar37 >> 3 ^
               (uVar24 << 0xe | uVar37 >> 0x12) ^ ((uVar17 >> 0x18) << 0x19 | uVar37 >> 7)) +
               (uVar19 >> 10 ^ (uVar32 << 0xd | uVar22 >> 0x13) ^ (uVar32 << 0xf | uVar22 >> 0x11));
      iVar12 = ((uVar45 * 0x80 | uVar45 >> 0x19) ^
               (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) +
               uVar42 + uVar19 + ((uVar44 ^ uVar58) & uVar45 ^ uVar58) + -0x1041b87a;
      uVar65 = uVar65 + iVar12;
      uVar16 = ((uVar15 | uVar51) & uVar34 | uVar15 & uVar51) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
      uVar42 = uVar37 + uVar27 +
               (uVar53 >> 3 ^
               (uVar35 << 0xe | uVar53 >> 0x12) ^ ((uVar13 >> 0x18) << 0x19 | uVar53 >> 7)) +
               (uVar46 >> 10 ^
               (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11));
      iVar12 = ((uVar65 * 0x80 | uVar65 >> 0x19) ^
               (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6)) +
               uVar58 + uVar42 + ((uVar45 ^ uVar44) & uVar65 ^ uVar44) + 0xfc19dc6;
      uVar34 = uVar34 + iVar12;
      uVar37 = ((uVar16 | uVar15) & uVar51 | uVar16 & uVar15) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar12;
      uVar23 = uVar53 + uVar28 +
               (uVar20 >> 3 ^
               (uVar52 << 0xe | uVar20 >> 0x12) ^ ((uVar38 >> 0x18) << 0x19 | uVar20 >> 7)) +
               (uVar19 >> 10 ^
               (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
      iVar12 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
               (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
               uVar44 + uVar23 + ((uVar65 ^ uVar45) & uVar34 ^ uVar45) + 0x240ca1cc;
      uVar51 = uVar51 + iVar12;
      uVar17 = ((uVar37 | uVar16) & uVar15 | uVar37 & uVar16) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar12;
      uVar24 = uVar20 + uVar29 +
               (uVar21 >> 3 ^
               (uVar55 << 0xe | uVar21 >> 0x12) ^ ((uVar48 >> 0x18) << 0x19 | uVar21 >> 7)) +
               (uVar42 >> 10 ^
               (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11));
      iVar12 = ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               uVar45 + uVar24 + ((uVar34 ^ uVar65) & uVar51 ^ uVar65) + 0x2de92c6f;
      uVar15 = uVar15 + iVar12;
      uVar38 = ((uVar17 | uVar37) & uVar16 | uVar17 & uVar37) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
      uVar13 = uVar21 + uVar31 +
               (uVar49 >> 3 ^
               (uVar56 << 0xe | uVar49 >> 0x12) ^ ((uVar18 >> 0x18) << 0x19 | uVar49 >> 7)) +
               (uVar23 >> 10 ^
               (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
               (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
               uVar65 + uVar13 + ((uVar51 ^ uVar34) & uVar15 ^ uVar34) + 0x4a7484aa;
      uVar16 = uVar16 + iVar12;
      uVar35 = ((uVar38 | uVar17) & uVar37 | uVar38 & uVar17) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
      uVar18 = uVar49 + uVar32 +
               (uVar50 >> 3 ^
               (uVar57 << 0xe | uVar50 >> 0x12) ^ ((uVar14 >> 0x18) << 0x19 | uVar50 >> 7)) +
               (uVar24 >> 10 ^
               (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
      iVar12 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar34 + uVar18 + ((uVar15 ^ uVar51) & uVar16 ^ uVar51) + 0x5cb0a9dc;
      uVar37 = uVar37 + iVar12;
      uVar14 = ((uVar35 | uVar38) & uVar17 | uVar35 & uVar38) +
               ((uVar35 * 0x400 | uVar35 >> 0x16) ^
               (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
      uVar65 = (uVar40 >> 3 ^
               (uVar59 << 0xe | uVar40 >> 0x12) ^ ((uVar39 >> 0x18) << 0x19 | uVar40 >> 7)) + uVar50
               + uVar46 +
               (uVar13 >> 10 ^
               (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar12 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar51 + uVar65 + ((uVar16 ^ uVar15) & uVar37 ^ uVar15) + 0x76f988da;
      uVar17 = uVar17 + iVar12;
      uVar10 = ((uVar14 | uVar35) & uVar38 | uVar14 & uVar35) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
      uVar56 = (uVar41 >> 3 ^
               (uVar60 << 0xe | uVar41 >> 0x12) ^ ((uVar9 >> 0x18) << 0x19 | uVar41 >> 7)) + uVar40
               + uVar19 +
               (uVar18 >> 10 ^
               (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
      iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
               uVar15 + uVar56 + ((uVar37 ^ uVar16) & uVar17 ^ uVar16) + -0x67c1aeae;
      uVar38 = uVar38 + iVar12;
      uVar48 = ((uVar10 | uVar14) & uVar35 | uVar10 & uVar14) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
      uVar9 = (uVar26 >> 3 ^
              (uVar61 << 0xe | uVar26 >> 0x12) ^ ((uVar25 >> 0x18) << 0x19 | uVar26 >> 7)) + uVar41
              + uVar42 +
              (uVar65 >> 10 ^
              (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
      iVar12 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar16 + uVar9 + ((uVar17 ^ uVar37) & uVar38 ^ uVar37) + -0x57ce3993;
      uVar35 = uVar35 + iVar12;
      uVar55 = ((uVar48 | uVar10) & uVar14 | uVar48 & uVar10) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar12;
      uVar25 = (uVar27 >> 3 ^
               (uVar62 << 0xe | uVar27 >> 0x12) ^ ((uVar33 >> 0x18) << 0x19 | uVar27 >> 7)) + uVar26
               + uVar23 +
               (uVar56 >> 10 ^
               (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
               (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
               uVar37 + uVar25 + ((uVar38 ^ uVar17) & uVar35 ^ uVar17) + -0x4ffcd838;
      uVar14 = uVar14 + iVar12;
      uVar52 = ((uVar55 | uVar48) & uVar10 | uVar55 & uVar48) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
      uVar15 = (uVar28 >> 3 ^
               (uVar63 << 0xe | uVar28 >> 0x12) ^ ((uVar43 >> 0x18) << 0x19 | uVar28 >> 7)) + uVar27
               + uVar24 +
               (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar12 = uVar17 + uVar15 + ((uVar35 ^ uVar38) & uVar14 ^ uVar38) +
               ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               -0x40a68039;
      uVar10 = uVar10 + iVar12;
      uVar33 = ((uVar52 | uVar55) & uVar48 | uVar52 & uVar55) +
               ((uVar52 * 0x400 | uVar52 >> 0x16) ^
               (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar12;
      uVar54 = (uVar29 >> 3 ^
               (uVar64 << 0xe | uVar29 >> 0x12) ^ ((uVar54 >> 0x18) << 0x19 | uVar29 >> 7)) + uVar28
               + uVar13 +
               (uVar25 >> 10 ^
               (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      iVar12 = uVar38 + uVar54 + ((uVar14 ^ uVar35) & uVar10 ^ uVar35) +
               ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               -0x391ff40d;
      uVar48 = uVar48 + iVar12;
      uVar17 = ((uVar33 | uVar52) & uVar55 | uVar33 & uVar52) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar12;
      uVar16 = (uVar31 >> 3 ^
               (uVar31 << 0xe | uVar30 >> 0x12) ^ ((uint)hash->buf[0x3b] << 0x19 | uVar31 >> 7)) +
               uVar29 + uVar18 +
               (uVar15 >> 10 ^
               (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar12 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               uVar35 + uVar16 + ((uVar10 ^ uVar14) & uVar48 ^ uVar14) + -0x2a586eb9;
      uVar55 = uVar55 + iVar12;
      uVar39 = ((uVar17 | uVar33) & uVar52 | uVar17 & uVar33) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
      uVar59 = (uVar32 >> 3 ^
               (uVar32 << 0xe | uVar22 >> 0x12) ^ ((uint)hash->buf[0x3f] << 0x19 | uVar32 >> 7)) +
               uVar31 + uVar65 +
               (uVar54 >> 10 ^
               (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
      iVar12 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar14 + uVar59 + ((uVar48 ^ uVar10) & uVar55 ^ uVar10) + 0x6ca6351;
      uVar52 = uVar52 + iVar12;
      uVar14 = ((uVar39 | uVar17) & uVar33 | uVar39 & uVar17) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar12;
      uVar57 = (uVar46 >> 3 ^
               (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7)) + uVar32 +
               uVar56 + (uVar16 >> 10 ^
                        (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11));
      iVar12 = uVar10 + uVar57 + ((uVar55 ^ uVar48) & uVar52 ^ uVar48) +
               ((uVar52 * 0x80 | uVar52 >> 0x19) ^
               (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6)) +
               0x14292967;
      uVar33 = uVar33 + iVar12;
      uVar10 = ((uVar14 | uVar39) & uVar17 | uVar14 & uVar39) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
      uVar60 = (uVar19 >> 3 ^
               (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar46 +
               uVar9 + (uVar59 >> 10 ^
                       (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
      iVar12 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar48 + uVar60 + ((uVar52 ^ uVar55) & uVar33 ^ uVar55) + 0x27b70a85;
      uVar17 = uVar17 + iVar12;
      uVar48 = ((uVar10 | uVar14) & uVar39 | uVar10 & uVar14) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
      uVar61 = (uVar42 >> 3 ^
               (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7)) + uVar19 +
               uVar25 + (uVar57 >> 10 ^
                        (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
      iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
               uVar55 + uVar61 + ((uVar33 ^ uVar52) & uVar17 ^ uVar52) + 0x2e1b2138;
      uVar39 = uVar39 + iVar12;
      uVar55 = ((uVar48 | uVar10) & uVar14 | uVar48 & uVar10) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar12;
      uVar35 = (uVar23 >> 3 ^
               (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) + uVar42 +
               uVar15 + (uVar60 >> 10 ^
                        (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar12 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
               (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
               uVar52 + uVar35 + ((uVar17 ^ uVar33) & uVar39 ^ uVar33) + 0x4d2c6dfc;
      uVar14 = uVar14 + iVar12;
      uVar43 = ((uVar55 | uVar48) & uVar10 | uVar55 & uVar48) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
      uVar19 = (uVar24 >> 3 ^
               (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar23 +
               uVar54 + (uVar61 >> 10 ^
                        (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
      iVar12 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar33 + uVar19 + ((uVar39 ^ uVar17) & uVar14 ^ uVar17) + 0x53380d13;
      uVar10 = uVar10 + iVar12;
      uVar38 = ((uVar43 | uVar55) & uVar48 | uVar43 & uVar55) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
      uVar52 = (uVar13 >> 3 ^
               (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7)) + uVar24 +
               uVar16 + (uVar35 >> 10 ^
                        (uVar35 * 0x2000 | uVar35 >> 0x13) ^ (uVar35 * 0x8000 | uVar35 >> 0x11));
      iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar17 + uVar52 + ((uVar14 ^ uVar39) & uVar10 ^ uVar39) + 0x650a7354;
      uVar48 = uVar48 + iVar12;
      uVar33 = ((uVar38 | uVar43) & uVar55 | uVar38 & uVar43) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
      uVar62 = (uVar18 >> 3 ^
               (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) + uVar13 +
               uVar59 + (uVar19 >> 10 ^
                        (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
      iVar12 = ((uVar48 * 0x80 | uVar48 >> 0x19) ^
               (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6)) +
               uVar39 + uVar62 + ((uVar10 ^ uVar14) & uVar48 ^ uVar14) + 0x766a0abb;
      uVar55 = uVar55 + iVar12;
      uVar24 = ((uVar33 | uVar38) & uVar43 | uVar33 & uVar38) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar12;
      uVar63 = (uVar65 >> 3 ^
               (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) + uVar18 +
               uVar57 + (uVar52 >> 10 ^
                        (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar12 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar14 + uVar63 + ((uVar48 ^ uVar10) & uVar55 ^ uVar10) + -0x7e3d36d2;
      uVar43 = uVar43 + iVar12;
      uVar13 = ((uVar24 | uVar33) & uVar38 | uVar24 & uVar33) +
               ((uVar24 * 0x400 | uVar24 >> 0x16) ^
               (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar12;
      uVar22 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar65 +
               uVar60 + (uVar62 >> 10 ^
                        (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
      iVar12 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
               (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
               uVar10 + uVar22 + ((uVar55 ^ uVar48) & uVar43 ^ uVar48) + -0x6d8dd37b;
      uVar38 = uVar38 + iVar12;
      uVar39 = ((uVar13 | uVar24) & uVar33 | uVar13 & uVar24) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar12;
      uVar65 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
               uVar56 + uVar61 +
               (uVar63 >> 10 ^
               (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11));
      iVar12 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar48 + uVar65 + ((uVar43 ^ uVar55) & uVar38 ^ uVar55) + -0x5d40175f;
      uVar33 = uVar33 + iVar12;
      uVar10 = ((uVar39 | uVar13) & uVar24 | uVar39 & uVar13) +
               ((uVar39 * 0x400 | uVar39 >> 0x16) ^
               (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar12;
      uVar48 = (uVar25 >> 3 ^
               (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) + uVar9 +
               uVar35 + (uVar22 >> 10 ^
                        (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      iVar12 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar55 + uVar48 + ((uVar38 ^ uVar43) & uVar33 ^ uVar43) + -0x57e599b5;
      uVar24 = uVar24 + iVar12;
      uVar17 = ((uVar10 | uVar39) & uVar13 | uVar10 & uVar39) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
      uVar20 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar25 +
               uVar19 + (uVar65 >> 10 ^
                        (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
      iVar12 = ((uVar24 * 0x80 | uVar24 >> 0x19) ^
               (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
               uVar43 + uVar20 + ((uVar33 ^ uVar38) & uVar24 ^ uVar38) + -0x3db47490;
      uVar13 = uVar13 + iVar12;
      uVar64 = ((uVar17 | uVar10) & uVar39 | uVar17 & uVar10) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
      uVar18 = (uVar54 >> 3 ^
               (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7)) + uVar15 +
               uVar52 + (uVar48 >> 10 ^
                        (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar12 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               uVar38 + uVar18 + ((uVar24 ^ uVar33) & uVar13 ^ uVar33) + -0x3893ae5d;
      uVar39 = uVar39 + iVar12;
      uVar14 = ((uVar64 | uVar17) & uVar10 | uVar64 & uVar17) +
               ((uVar64 * 0x400 | uVar64 >> 0x16) ^
               (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar12;
      uVar54 = (uVar16 >> 3 ^
               (uVar16 * 0x4000 | uVar16 >> 0x12) ^ (uVar16 * 0x2000000 | uVar16 >> 7)) + uVar54 +
               uVar62 + (uVar20 >> 10 ^
                        (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
      iVar12 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
               (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
               uVar33 + uVar54 + ((uVar13 ^ uVar24) & uVar39 ^ uVar24) + -0x2e6d17e7;
      uVar10 = uVar10 + iVar12;
      uVar38 = ((uVar14 | uVar64) & uVar17 | uVar14 & uVar64) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
      uVar23 = (uVar59 >> 3 ^
               (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) + uVar16 +
               uVar63 + (uVar18 >> 10 ^
                        (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
      iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar24 + uVar23 + ((uVar39 ^ uVar13) & uVar10 ^ uVar13) + -0x2966f9dc;
      uVar17 = uVar17 + iVar12;
      uVar33 = ((uVar38 | uVar14) & uVar64 | uVar38 & uVar14) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
      uVar25 = (uVar57 >> 3 ^
               (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7)) + uVar59 +
               uVar22 + (uVar54 >> 10 ^
                        (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
      iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
               uVar13 + uVar25 + ((uVar10 ^ uVar39) & uVar17 ^ uVar39) + -0xbf1ca7b;
      uVar64 = uVar64 + iVar12;
      uVar43 = ((uVar33 | uVar38) & uVar14 | uVar33 & uVar38) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar12;
      uVar24 = (uVar60 >> 3 ^
               (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)) + uVar57 +
               uVar65 + (uVar23 >> 10 ^
                        (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      iVar12 = ((uVar64 * 0x80 | uVar64 >> 0x19) ^
               (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) +
               uVar39 + uVar24 + ((uVar17 ^ uVar10) & uVar64 ^ uVar10) + 0x106aa070;
      uVar14 = uVar14 + iVar12;
      uVar56 = ((uVar43 | uVar33) & uVar38 | uVar43 & uVar33) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
      uVar9 = (uVar61 >> 3 ^ (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)
              ) + uVar60 + uVar48 +
              (uVar25 >> 10 ^
              (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11));
      iVar12 = uVar10 + uVar9 + ((uVar64 ^ uVar17) & uVar14 ^ uVar17) +
               ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               0x19a4c116;
      uVar38 = uVar38 + iVar12;
      uVar55 = ((uVar56 | uVar43) & uVar33 | uVar56 & uVar43) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar12;
      uVar39 = (uVar35 >> 3 ^
               (uVar35 * 0x4000 | uVar35 >> 0x12) ^ (uVar35 * 0x2000000 | uVar35 >> 7)) + uVar61 +
               uVar20 + (uVar24 >> 10 ^
                        (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
      iVar12 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar17 + uVar39 + ((uVar14 ^ uVar64) & uVar38 ^ uVar64) + 0x1e376c08;
      uVar33 = uVar33 + iVar12;
      uVar10 = ((uVar55 | uVar56) & uVar43 | uVar55 & uVar56) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
      uVar59 = (uVar19 >> 3 ^
               (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar35 +
               uVar18 + (uVar9 >> 10 ^
                        (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar12 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar64 + uVar59 + ((uVar38 ^ uVar14) & uVar33 ^ uVar14) + 0x2748774c;
      uVar43 = uVar43 + iVar12;
      uVar61 = ((uVar10 | uVar55) & uVar56 | uVar10 & uVar55) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
      uVar17 = (uVar52 >> 3 ^
               (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7)) + uVar19 +
               uVar54 + (uVar39 >> 10 ^
                        (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11));
      iVar12 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
               (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
               uVar14 + uVar17 + ((uVar33 ^ uVar38) & uVar43 ^ uVar38) + 0x34b0bcb5;
      uVar56 = uVar56 + iVar12;
      uVar57 = ((uVar61 | uVar10) & uVar55 | uVar61 & uVar10) +
               ((uVar61 * 0x400 | uVar61 >> 0x16) ^
               (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar12;
      uVar13 = (uVar62 >> 3 ^
               (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) + uVar52 +
               uVar23 + (uVar59 >> 10 ^
                        (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
      iVar12 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               uVar38 + uVar13 + ((uVar43 ^ uVar33) & uVar56 ^ uVar33) + 0x391c0cb3;
      uVar55 = uVar55 + iVar12;
      uVar38 = ((uVar57 | uVar61) & uVar10 | uVar57 & uVar61) +
               ((uVar57 * 0x400 | uVar57 >> 0x16) ^
               (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar12;
      uVar35 = (uVar63 >> 3 ^
               (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7)) + uVar62 +
               uVar25 + (uVar17 >> 10 ^
                        (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar12 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar33 + uVar35 + ((uVar56 ^ uVar43) & uVar55 ^ uVar43) + 0x4ed8aa4a;
      uVar10 = uVar10 + iVar12;
      uVar60 = ((uVar38 | uVar57) & uVar61 | uVar38 & uVar57) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
      uVar14 = (uVar22 >> 3 ^
               (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) + uVar63 +
               uVar24 + (uVar13 >> 10 ^
                        (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar43 + uVar14 + ((uVar55 ^ uVar56) & uVar10 ^ uVar56) + 0x5b9cca4f;
      uVar61 = uVar61 + iVar12;
      uVar43 = ((uVar60 | uVar38) & uVar57 | uVar60 & uVar38) +
               ((uVar60 * 0x400 | uVar60 >> 0x16) ^
               (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar12;
      uVar52 = (uVar65 >> 3 ^
               (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) + uVar22 +
               uVar9 + (uVar35 >> 10 ^
                       (uVar35 * 0x2000 | uVar35 >> 0x13) ^ (uVar35 * 0x8000 | uVar35 >> 0x11));
      iVar12 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
               (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
               uVar56 + uVar52 + ((uVar10 ^ uVar55) & uVar61 ^ uVar55) + 0x682e6ff3;
      uVar57 = uVar57 + iVar12;
      uVar33 = ((uVar43 | uVar60) & uVar38 | uVar43 & uVar60) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
      uVar39 = (uVar48 >> 3 ^
               (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7)) + uVar65 +
               uVar39 + (uVar14 >> 10 ^
                        (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
      iVar12 = ((uVar57 * 0x80 | uVar57 >> 0x19) ^
               (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6)) +
               uVar55 + uVar39 + ((uVar61 ^ uVar10) & uVar57 ^ uVar10) + 0x748f82ee;
      uVar38 = uVar38 + iVar12;
      uVar55 = ((uVar33 | uVar43) & uVar60 | uVar33 & uVar43) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar12;
      uVar48 = (uVar20 >> 3 ^
               (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7)) + uVar48 +
               uVar59 + (uVar52 >> 10 ^
                        (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11));
      iVar12 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar10 + uVar48 + ((uVar57 ^ uVar61) & uVar38 ^ uVar61) + 0x78a5636f;
      uVar60 = uVar60 + iVar12;
      uVar56 = ((uVar55 | uVar33) & uVar43 | uVar55 & uVar33) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
      uVar10 = (uVar18 >> 3 ^
               (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) + uVar20 +
               uVar17 + (uVar39 >> 10 ^
                        (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11));
      iVar12 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
               (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
               uVar61 + uVar10 + ((uVar38 ^ uVar57) & uVar60 ^ uVar57) + -0x7b3787ec;
      uVar43 = uVar43 + iVar12;
      uVar17 = ((uVar56 | uVar55) & uVar33 | uVar56 & uVar55) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar12;
      uVar13 = (uVar54 >> 3 ^
               (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7)) + uVar18 +
               uVar13 + (uVar48 >> 10 ^
                        (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11));
      iVar12 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
               (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
               uVar57 + uVar13 + ((uVar60 ^ uVar38) & uVar43 ^ uVar38) + -0x7338fdf8;
      uVar33 = uVar33 + iVar12;
      uVar48 = ((uVar17 | uVar56) & uVar55 | uVar17 & uVar56) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
      uVar54 = (uVar23 >> 3 ^
               (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) + uVar54 +
               uVar35 + (uVar10 >> 10 ^
                        (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
      iVar12 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar38 + uVar54 + ((uVar43 ^ uVar60) & uVar33 ^ uVar60) + -0x6f410006;
      uVar55 = uVar55 + iVar12;
      uVar18 = ((uVar48 | uVar17) & uVar56 | uVar48 & uVar17) +
               ((uVar48 * 0x400 | uVar48 >> 0x16) ^
               (uVar48 * 0x80000 | uVar48 >> 0xd) ^ (uVar48 * 0x40000000 | uVar48 >> 2)) + iVar12;
      uVar13 = (uVar25 >> 3 ^
               (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7)) + uVar23 +
               uVar14 + (uVar13 >> 10 ^
                        (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar12 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar60 + uVar13 + ((uVar33 ^ uVar43) & uVar55 ^ uVar43) + -0x5baf9315;
      uVar56 = uVar56 + iVar12;
      uVar10 = ((uVar18 | uVar48) & uVar17 | uVar18 & uVar48) +
               ((uVar18 * 0x400 | uVar18 >> 0x16) ^
               (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar12;
      iVar12 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               (uVar24 >> 3 ^
               (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar25 +
               uVar52 + (uVar54 >> 10 ^
                        (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11)) +
               uVar43 + ((uVar55 ^ uVar33) & uVar56 ^ uVar33) + -0x41065c09;
      uVar17 = uVar17 + iVar12;
      uVar38 = ((uVar10 | uVar18) & uVar48 | uVar10 & uVar18) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
      iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
               (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
               uVar24 + uVar39 +
               (uVar13 >> 10 ^
               (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)) + uVar33 +
               ((uVar56 ^ uVar55) & uVar17 ^ uVar55) + -0x398e870e;
      hash->s[0] = ((uVar38 | uVar10) & uVar18 | uVar38 & uVar10) + uVar1 +
                   ((uVar38 * 0x400 | uVar38 >> 0x16) ^
                   (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) +
                   iVar12;
      hash->s[1] = uVar38 + uVar2;
      hash->s[2] = uVar10 + uVar3;
      hash->s[3] = uVar18 + uVar4;
      hash->s[4] = uVar48 + uVar5 + iVar12;
      hash->s[5] = uVar17 + uVar6;
      hash->s[6] = uVar56 + uVar7;
      hash->s[7] = uVar55 + uVar8;
      __n = 0x40;
      uVar36 = 0;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy(hash->buf + local_a8,data,len);
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(hash->buf + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(hash->buf + bufsize, data, len);
    }
}